

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duckdb_value-c.cpp
# Opt level: O3

char * duckdb_value_to_string(duckdb_value val)

{
  char *__dest;
  string str;
  Value v;
  string local_80;
  Value local_60;
  
  if (val == (duckdb_value)0x0) {
    __dest = (char *)0x0;
  }
  else {
    duckdb::Value::Value(&local_60,(Value *)val);
    duckdb::Value::ToSQLString_abi_cxx11_(&local_80,&local_60);
    __dest = (char *)malloc(local_80._M_string_length + 1);
    switchD_012b9b0d::default(__dest,local_80._M_dataplus._M_p,local_80._M_string_length);
    __dest[local_80._M_string_length] = '\0';
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p);
    }
    duckdb::Value::~Value(&local_60);
  }
  return __dest;
}

Assistant:

char *duckdb_value_to_string(duckdb_value val) {
	if (!val) {
		return nullptr;
	}

	auto v = UnwrapValue(val);
	auto str = v.ToSQLString();

	auto result = reinterpret_cast<char *>(malloc(sizeof(char) * (str.size() + 1)));
	memcpy(result, str.c_str(), str.size());
	result[str.size()] = '\0';
	return result;
}